

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::TestRecursiveMessage::_InternalSerialize
          (TestRecursiveMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestRecursiveMessage *value;
  ulong uVar1;
  anon_union_24_1_493b367e_for_TestRecursiveMessage_3 aVar2;
  uint8_t *puVar3;
  
  aVar2 = this->field_0;
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
    value = (this->field_0)._impl_.a_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (1,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
  }
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>
                       (stream,(this->field_0)._impl_.i_,target);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestRecursiveMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestRecursiveMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestRecursiveMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.TestRecursiveMessage a = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.a_, this_._impl_.a_->GetCachedSize(), target,
        stream);
  }

  // int32 i = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>(
            stream, this_._internal_i(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestRecursiveMessage)
  return target;
}